

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompose.hpp
# Opt level: O3

void __thiscall
MGARD::Decomposer<float>::decompose_level_1D
          (Decomposer<float> *this,float *data_pos,size_t n,float h,bool nodal_row)

{
  size_t n_nodal;
  ulong uVar1;
  float fVar2;
  float *nodal_buffer;
  ulong uVar3;
  float *pfVar4;
  size_t n_coeff;
  ulong uVar5;
  size_t sVar6;
  float *pfVar7;
  
  uVar5 = n >> 1;
  n_nodal = uVar5 + 1;
  nodal_buffer = this->data_buffer;
  n_coeff = n - n_nodal;
  pfVar7 = nodal_buffer;
  pfVar4 = data_pos;
  for (sVar6 = n_coeff; sVar6 != 0; sVar6 = sVar6 - 1) {
    *pfVar7 = *pfVar4;
    pfVar7[uVar5 + 1] = pfVar4[1];
    pfVar7 = pfVar7 + 1;
    pfVar4 = pfVar4 + 2;
  }
  fVar2 = *pfVar4;
  *pfVar7 = fVar2;
  uVar1 = n_coeff + 1;
  if (uVar1 == uVar5) {
    pfVar7[1] = (pfVar4[1] + pfVar4[1]) - fVar2;
  }
  pfVar7 = nodal_buffer + uVar5 + 1;
  if (n == n_nodal) {
    if (!nodal_row) {
LAB_00105b0d:
      compute_load_vector_coeff_row<float>
                (this->load_v_buffer,n_nodal,n_coeff,h,nodal_buffer,pfVar7);
      pfVar4 = this->load_v_buffer;
      goto LAB_00105b2c;
    }
    pfVar4 = this->load_v_buffer;
    *pfVar4 = *pfVar7 * 0.5;
  }
  else {
    uVar3 = 1;
    do {
      nodal_buffer[uVar5 + uVar3] =
           (nodal_buffer[uVar3 - 1] + nodal_buffer[uVar3]) * -0.5 + nodal_buffer[uVar5 + uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    if (!nodal_row) goto LAB_00105b0d;
    pfVar4 = this->load_v_buffer;
    *pfVar4 = *pfVar7 * 0.5;
    if (1 < n_coeff) {
      uVar3 = 2;
      do {
        pfVar4[uVar3 - 1] = (nodal_buffer[uVar5 + (uVar3 - 1)] + nodal_buffer[uVar5 + uVar3]) * 0.5;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  pfVar4[n_coeff] = nodal_buffer[n - 1] * 0.5;
  if (uVar1 == uVar5) {
    pfVar4[n_coeff + 1] = 0.0;
  }
LAB_00105b2c:
  compute_correction<float>(this->correction_buffer,n_nodal,h,pfVar4);
  pfVar7 = this->correction_buffer;
  sVar6 = 0;
  do {
    nodal_buffer[sVar6] = pfVar7[sVar6] + nodal_buffer[sVar6];
    sVar6 = sVar6 + 1;
  } while (n_nodal != sVar6);
  memcpy(data_pos,this->data_buffer,n << 2);
  return;
}

Assistant:

void decompose_level_1D(T * data_pos, size_t n, T h, bool nodal_row=true){
		size_t n_nodal = (n >> 1) + 1;
		size_t n_coeff = n - n_nodal;
		T * nodal_buffer = data_buffer;
		T * coeff_buffer = data_buffer + n_nodal;
		data_reorder_1D(data_pos, n_nodal, n_coeff, nodal_buffer, coeff_buffer);
		compute_interpolant_difference_1D(n_coeff, nodal_buffer, coeff_buffer);
		if(nodal_row) compute_load_vector_nodal_row(load_v_buffer, n_nodal, n_coeff, h, coeff_buffer);
        else compute_load_vector_coeff_row(load_v_buffer, n_nodal, n_coeff, h, nodal_buffer, coeff_buffer);
		compute_correction(correction_buffer, n_nodal, h, load_v_buffer);
		add_correction(n_nodal, nodal_buffer);
		memcpy(data_pos, data_buffer, n*sizeof(T));
	}